

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  SystemInfo *pSVar2;
  InstanceBuilder *this;
  Instance *pIVar3;
  ostream *poVar4;
  int iVar5;
  error_code eVar6;
  Result<vkb::Instance> inst_ret;
  SystemInfo system_info;
  Result<vkb::SystemInfo> system_info_ret;
  Instance vkb_inst;
  InstanceBuilder instance_builder;
  
  vkb::InstanceBuilder::InstanceBuilder(&instance_builder);
  vkb::SystemInfo::get_system_info();
  if (system_info_ret.m_init == false) {
    eVar6 = vkb::Result<vkb::SystemInfo>::error(&system_info_ret);
    (**(code **)(*(long *)eVar6._M_cat + 0x20))(&inst_ret,eVar6._M_cat,eVar6._M_value);
    poVar4 = std::operator<<((ostream *)&std::cerr,(char *)inst_ret.field_0.m_value.instance);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&inst_ret);
    iVar5 = -1;
  }
  else {
    pSVar2 = vkb::Result<vkb::SystemInfo>::value(&system_info_ret);
    vkb::SystemInfo::SystemInfo(&system_info,pSVar2);
    bVar1 = vkb::SystemInfo::is_layer_available(&system_info,"VK_LAYER_LUNARG_api_dump");
    if (bVar1) {
      vkb::InstanceBuilder::enable_layer(&instance_builder,"VK_LAYER_LUNARG_api_dump");
    }
    if (system_info.validation_layers_available == true) {
      this = vkb::InstanceBuilder::enable_validation_layers(&instance_builder,true);
      vkb::InstanceBuilder::use_default_debug_messenger(this);
    }
    bVar1 = vkb::SystemInfo::is_extension_available
                      (&system_info,"VK_KHR_get_physical_device_properties2");
    if (bVar1) {
      vkb::InstanceBuilder::enable_extension
                (&instance_builder,"VK_KHR_get_physical_device_properties2");
    }
    vkb::InstanceBuilder::build(&inst_ret,&instance_builder);
    if (inst_ret.m_init == false) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to create Vulkan instance. Error: ");
      eVar6 = vkb::Result<vkb::Instance>::error(&inst_ret);
      (**(code **)(*(long *)eVar6._M_cat + 0x20))(&vkb_inst,eVar6._M_cat,eVar6._M_value);
      poVar4 = std::operator<<(poVar4,(string *)&vkb_inst);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&vkb_inst);
      iVar5 = -1;
    }
    else {
      pIVar3 = vkb::Result<vkb::Instance>::value(&inst_ret);
      vkb_inst.instance = pIVar3->instance;
      vkb_inst.debug_messenger = pIVar3->debug_messenger;
      vkb_inst.allocation_callbacks = pIVar3->allocation_callbacks;
      vkb_inst.fp_vkGetInstanceProcAddr = pIVar3->fp_vkGetInstanceProcAddr;
      vkb_inst.fp_vkGetDeviceProcAddr = pIVar3->fp_vkGetDeviceProcAddr;
      vkb_inst.instance_version = pIVar3->instance_version;
      vkb_inst.api_version = pIVar3->api_version;
      vkb_inst.headless = pIVar3->headless;
      vkb_inst.properties2_ext_enabled = pIVar3->properties2_ext_enabled;
      vkb_inst._50_6_ = *(undefined6 *)&pIVar3->field_0x32;
      vkb::destroy_instance(&vkb_inst);
      iVar5 = 0;
    }
    vkb::SystemInfo::~SystemInfo(&system_info);
  }
  vkb::Result<vkb::SystemInfo>::destroy(&system_info_ret);
  vkb::InstanceBuilder::InstanceInfo::~InstanceInfo(&instance_builder.info);
  return iVar5;
}

Assistant:

int main() {
    vkb::InstanceBuilder instance_builder;

    auto system_info_ret = vkb::SystemInfo::get_system_info();
    if (!system_info_ret) {
        std::cerr << system_info_ret.error().message().c_str() << "\n";
        return -1;
    }
    auto system_info = system_info_ret.value();

    // check for a layer
    if (system_info.is_layer_available("VK_LAYER_LUNARG_api_dump")) {
        instance_builder.enable_layer("VK_LAYER_LUNARG_api_dump");
    }

    // of course dedicated variable for validation
    if (system_info.validation_layers_available) {
        instance_builder
            .enable_validation_layers()
            // Validation needs to send errors via a callback, have vk-bootstrap do it
            .use_default_debug_messenger();
    }

    // if you need an instance level extension
    if (system_info.is_extension_available("VK_KHR_get_physical_device_properties2")) {
        instance_builder.enable_extension("VK_KHR_get_physical_device_properties2");
    }

    // Build instance now!
    auto inst_ret = instance_builder.build();
    if (!inst_ret) {
        std::cerr << "Failed to create Vulkan instance. Error: " << inst_ret.error().message() << "\n";
        return -1;
    }
    vkb::Instance vkb_inst = inst_ret.value();

    // fancy app logic

    vkb::destroy_instance(vkb_inst);
    return 0;
}